

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write.c
# Opt level: O1

int evfilt_write_knote_create(filter *filt,knote *kn)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  uint32_t local_2c;
  epoll_udata *local_28;
  
  iVar2 = linux_get_descriptor_type(kn);
  if (-1 < iVar2) {
    if ((kn->kn_flags & 1) == 0) {
      iVar2 = -0x7ffffffc;
      if (((kn->kev).flags & 0x20) == 0) {
        iVar2 = 4;
      }
      kn->epoll_events = iVar2;
      iVar2 = epoll_update(1,filt,kn,iVar2,false);
      return iVar2;
    }
    uVar1 = (kn->kev).flags;
    iVar2 = -0x7fffdfff;
    if ((uVar1 & 0x20) == 0) {
      iVar2 = 0x2001;
    }
    iVar3 = iVar2 + 0x40000000;
    if ((uVar1 & 0x90) == 0) {
      iVar3 = iVar2;
    }
    kn->epoll_events = iVar3;
    kn->kn_epollfd = filt->kf_kqueue->epollfd;
    iVar2 = eventfd(0,0);
    if (-1 < iVar2) {
      iVar3 = eventfd_write(iVar2,1);
      if (-1 < iVar3) {
        (kn->field_10).kn_timerfd = iVar2;
        local_28 = &kn->kn_udata;
        (kn->kn_udata).field_0.ud_kn = kn;
        (kn->kn_udata).ud_type = EPOLL_UDATA_KNOTE;
        local_2c = kn->epoll_events;
        iVar3 = epoll_ctl(kn->kn_epollfd,1,iVar2,(epoll_event *)&local_2c);
        if (-1 < iVar3) {
          kn->kn_registered = 1;
          return 0;
        }
      }
      close(iVar2);
    }
  }
  return -1;
}

Assistant:

int
evfilt_write_knote_create(struct filter *filt, struct knote *kn)
{
    if (linux_get_descriptor_type(kn) < 0)
        return (-1);

    /*
     * Epoll won't allow us to add EPOLLOUT on a regular file
     * and just fails with EPERM.
     *
     * So we add a surrogate eventfd that is always polls.
     */
    if (kn->kn_flags & KNFL_FILE) {
        int evfd;

        /* Convert the kevent into an epoll_event */
#if defined(HAVE_EPOLLRDHUP)
        kn->epoll_events = EPOLLIN | EPOLLRDHUP;
#else
        kn->epoll_events = EPOLLIN;
#endif
        if (kn->kev.flags & EV_CLEAR)
            kn->epoll_events |= EPOLLET;

        /*
         * We only set oneshot for cases where we're not going to
         * be using EPOLL_CTL_MOD.
         */
        if (kn->kev.flags & EV_ONESHOT || kn->kev.flags & EV_DISPATCH)
            kn->epoll_events |= EPOLLONESHOT;

        kn->kn_epollfd = filter_epoll_fd(filt);
        evfd = eventfd(0, 0);
        if (evfd < 0) {
            dbg_perror("eventfd(2)");
            return (-1);
        }
        /* Now the FD will be permanently high */
        if (eventfd_write(evfd, 1) < 0) {
            dbg_perror("eventfd_write(3)");
            (void) close(evfd);
            return (-1);
        }

        kn->kn_eventfd = evfd;

        KN_UDATA(kn);   /* populate this knote's kn_udata field */
        if (epoll_ctl(kn->kn_epollfd, EPOLL_CTL_ADD, kn->kn_eventfd, EPOLL_EV_KN(kn->epoll_events, kn)) < 0) {
            dbg_printf("epoll_ctl(2): %s", strerror(errno));
            (void) close(evfd);
            return (-1);
        }

        kn->kn_registered = 1;

        return (0);
    }

    /*
     * Convert the kevent into an epoll_event
     */
    kn->epoll_events = EPOLLOUT;

    /*
     * For EV_ONESHOT, EV_DISPATCH we rely on common code
     * disabling/deleting the event after it's fired once.
     *
     * See this SO post for details:
     * https://stackoverflow.com/questions/59517961/how-should-i-use-epoll-to-read-and-write-from-the-same-fd
     */
    if (kn->kev.flags & EV_CLEAR)
        kn->epoll_events |= EPOLLET;

    return epoll_update(EPOLL_CTL_ADD, filt, kn, kn->epoll_events, false);
}